

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

int N_VDotProdMulti(int nvec,N_Vector x,N_Vector *Y,realtype *dotprods)

{
  _func_int_int_N_Vector_N_Vector_ptr_realtype_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  realtype rVar3;
  
  UNRECOVERED_JUMPTABLE = x->ops->nvdotprodmulti;
  if (UNRECOVERED_JUMPTABLE != (_func_int_int_N_Vector_N_Vector_ptr_realtype_ptr *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(nvec,x,Y,dotprods);
    return iVar1;
  }
  if (0 < nvec) {
    uVar2 = 0;
    do {
      rVar3 = (*x->ops->nvdotprod)(x,Y[uVar2]);
      dotprods[uVar2] = rVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)nvec != uVar2);
  }
  return 0;
}

Assistant:

int N_VDotProdMulti(int nvec, N_Vector x, N_Vector* Y, realtype* dotprods)
{
  int i, ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(x));

  if (x->ops->nvdotprodmulti != NULL) {

    ier = x->ops->nvdotprodmulti(nvec, x, Y, dotprods);

  } else {

    for (i=0; i<nvec; i++) {
      dotprods[i] = x->ops->nvdotprod(x, Y[i]);
    }
    ier = 0;

  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(x));
  return(ier);
}